

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::
CreateIdMappedExternalFunction<void*(*)(Js::RecyclableObject*,Js::CallInfo,void**)>
          (JavascriptLibrary *this,
          _func_void_ptr_RecyclableObject_ptr_CallInfo_void_ptr_ptr *entryPoint,
          DynamicType *pPrototypeType)

{
  Recycler *recycler;
  JavascriptExternalFunction *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&JavascriptExternalFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1947;
  recycler = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  this_00 = (JavascriptExternalFunction *)
            new<(Memory::ObjectInfoBits)1>
                      (0x70,recycler,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
  ;
  JavascriptExternalFunction::JavascriptExternalFunction
            (this_00,(ExternalMethod)entryPoint,pPrototypeType);
  return this_00;
}

Assistant:

JavascriptExternalFunction* JavascriptLibrary::CreateIdMappedExternalFunction(MethodType entryPoint, DynamicType *pPrototypeType)
    {
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptExternalFunction, entryPoint, pPrototypeType);
    }